

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::flipconstraints::flipconstraints(flipconstraints *this)

{
  flipconstraints *this_local;
  
  this->enqflag = 0;
  this->chkencflag = 0;
  this->unflip = 0;
  this->collectnewtets = 0;
  this->collectencsegflag = 0;
  this->remove_ndelaunay_edge = 0;
  this->bak_tetprism_vol = 0.0;
  this->tetprism_vol_sum = 0.0;
  this->remove_large_angle = 0;
  this->cosdihed_in = 0.0;
  this->cosdihed_out = 0.0;
  this->checkflipeligibility = 0;
  this->seg[0] = (point)0x0;
  this->fac[0] = (point)0x0;
  this->remvert = (point)0x0;
  return;
}

Assistant:

flipconstraints() {
      enqflag = 0; 
      chkencflag = 0;

      unflip = 0;
      collectnewtets = 0;
      collectencsegflag = 0;

      remove_ndelaunay_edge = 0;
      bak_tetprism_vol = 0.0;
      tetprism_vol_sum = 0.0;
      remove_large_angle = 0;
      cosdihed_in = 0.0;
      cosdihed_out = 0.0;

      checkflipeligibility = 0;
      seg[0] = NULL;
      fac[0] = NULL;
      remvert = NULL;
    }